

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

int64_t __thiscall libtorrent::aux::torrent_peer::total_download(torrent_peer *this)

{
  int iVar1;
  undefined4 extraout_var;
  torrent_peer *this_local;
  
  if (this->connection == (peer_connection_interface *)0x0) {
    this_local = (torrent_peer *)((ulong)this->prev_amount_download << 10);
  }
  else {
    iVar1 = (*this->connection->_vptr_peer_connection_interface[0xf])();
    this_local = (torrent_peer *)stat::total_payload_download((stat *)CONCAT44(extraout_var,iVar1));
  }
  return (int64_t)this_local;
}

Assistant:

std::int64_t torrent_peer::total_download() const
	{
		TORRENT_ASSERT(in_use);
		if (connection != nullptr)
		{
			TORRENT_ASSERT(prev_amount_download == 0);
			return connection->statistics().total_payload_download();
		}
		else
		{
			return std::int64_t(prev_amount_download) * 1024;
		}
	}